

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

void __thiscall
ThreadedReplayer::ThreadedReplayer(ThreadedReplayer *this,Options *device_opts_,Options *opts_)

{
  VkApplicationInfo *pVVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  __node_base_ptr *pp_Var7;
  long lVar8;
  
  (this->super_StateCreatorInterface)._vptr_StateCreatorInterface =
       (_func_int **)&PTR__ThreadedReplayer_002a12c0;
  Options::Options(&this->opts,opts_);
  (this->samplers)._M_h._M_buckets = &(this->samplers)._M_h._M_single_bucket;
  (this->samplers)._M_h._M_bucket_count = 1;
  (this->samplers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->samplers)._M_h._M_element_count = 0;
  (this->samplers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->samplers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->samplers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->layouts)._M_h._M_buckets = &(this->layouts)._M_h._M_single_bucket;
  (this->layouts)._M_h._M_bucket_count = 1;
  (this->layouts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->layouts)._M_h._M_element_count = 0;
  (this->layouts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->layouts)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->layouts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->pipeline_layouts)._M_h._M_buckets = &(this->pipeline_layouts)._M_h._M_single_bucket;
  (this->pipeline_layouts)._M_h._M_bucket_count = 1;
  (this->pipeline_layouts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pipeline_layouts)._M_h._M_element_count = 0;
  (this->pipeline_layouts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pipeline_layouts)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pipeline_layouts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->shader_modules).target_size = 0;
  (this->shader_modules).total_size = 0;
  (this->shader_modules).pool.vacants.
  super__Vector_base<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry_*,_std::allocator<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shader_modules).pool.vacants.
  super__Vector_base<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry_*,_std::allocator<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shader_modules).pool.vacants.
  super__Vector_base<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry_*,_std::allocator<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shader_modules).pool.memory.
  super__Vector_base<std::unique_ptr<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry,_Fossilize::ObjectPool<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry>::MallocDeleter>,_std::allocator<std::unique_ptr<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry,_Fossilize::ObjectPool<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry>::MallocDeleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shader_modules).pool.memory.
  super__Vector_base<std::unique_ptr<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry,_Fossilize::ObjectPool<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry>::MallocDeleter>,_std::allocator<std::unique_ptr<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry,_Fossilize::ObjectPool<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry>::MallocDeleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shader_modules).pool.memory.
  super__Vector_base<std::unique_ptr<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry,_Fossilize::ObjectPool<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry>::MallocDeleter>,_std::allocator<std::unique_ptr<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry,_Fossilize::ObjectPool<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry>::MallocDeleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->shader_modules).hash_to_objects._M_h._M_buckets =
       &(this->shader_modules).hash_to_objects._M_h._M_single_bucket;
  (this->shader_modules).hash_to_objects._M_h._M_bucket_count = 1;
  (this->shader_modules).hash_to_objects._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->shader_modules).hash_to_objects._M_h._M_element_count = 0;
  (this->shader_modules).hash_to_objects._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->shader_modules).hash_to_objects._M_h._M_rehash_policy._M_next_resize = 0;
  (this->shader_modules).hash_to_objects._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->shader_modules).lru_cache.head =
       (IntrusiveListEnabled<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry> *)0x0;
  (this->shader_modules).lru_cache.tail =
       (IntrusiveListEnabled<Fossilize::ObjectCache<VkShaderModule_T_*>::CacheEntry> *)0x0;
  (this->render_passes)._M_h._M_buckets = &(this->render_passes)._M_h._M_single_bucket;
  (this->render_passes)._M_h._M_bucket_count = 1;
  (this->render_passes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->render_passes)._M_h._M_element_count = 0;
  (this->render_passes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->render_passes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->render_passes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->compute_pipelines)._M_h._M_buckets = &(this->compute_pipelines)._M_h._M_single_bucket;
  (this->compute_pipelines)._M_h._M_bucket_count = 1;
  (this->compute_pipelines)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->compute_pipelines)._M_h._M_element_count = 0;
  (this->compute_pipelines)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->compute_pipelines)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->compute_pipelines)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->graphics_pipelines)._M_h._M_buckets = &(this->graphics_pipelines)._M_h._M_single_bucket;
  (this->graphics_pipelines)._M_h._M_bucket_count = 1;
  (this->graphics_pipelines)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->graphics_pipelines)._M_h._M_element_count = 0;
  (this->graphics_pipelines)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->graphics_pipelines)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->graphics_pipelines)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->raytracing_pipelines)._M_h._M_buckets = &(this->raytracing_pipelines)._M_h._M_single_bucket
  ;
  (this->raytracing_pipelines)._M_h._M_bucket_count = 1;
  (this->raytracing_pipelines)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->raytracing_pipelines)._M_h._M_element_count = 0;
  (this->raytracing_pipelines)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->raytracing_pipelines_cleared = 0;
  this->compute_pipelines_cleared = 0;
  this->graphics_pipelines_cleared = 0;
  (this->raytracing_pipelines)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->raytracing_pipelines)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->masked_shader_modules)._M_h._M_buckets =
       &(this->masked_shader_modules)._M_h._M_single_bucket;
  (this->masked_shader_modules)._M_h._M_bucket_count = 1;
  (this->masked_shader_modules)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->masked_shader_modules)._M_h._M_element_count = 0;
  (this->masked_shader_modules)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->masked_shader_modules)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->masked_shader_modules)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->shader_module_to_hash)._M_h._M_buckets =
       &(this->shader_module_to_hash)._M_h._M_single_bucket;
  (this->shader_module_to_hash)._M_h._M_bucket_count = 1;
  (this->shader_module_to_hash)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->shader_module_to_hash)._M_h._M_element_count = 0;
  (this->shader_module_to_hash)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->shader_module_to_hash)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->shader_module_to_hash)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->enqueued_shader_modules)._M_h._M_buckets =
       &(this->enqueued_shader_modules)._M_h._M_single_bucket;
  (this->enqueued_shader_modules)._M_h._M_bucket_count = 1;
  (this->enqueued_shader_modules)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->enqueued_shader_modules)._M_h._M_element_count = 0;
  (this->enqueued_shader_modules)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->enqueued_shader_modules)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->enqueued_shader_modules)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->disk_pipeline_cache = (VkPipelineCache)0x0;
  this->validation_cache = (VkValidationCacheEXT)0x0;
  uVar2 = (this->opts).loop_count;
  this->num_worker_threads = (this->opts).num_threads;
  this->loop_count = uVar2;
  this->queued_count[0] = 0;
  this->queued_count[1] = 0;
  this->queued_count[2] = 0;
  this->queued_count[3] = 0;
  this->completed_count[0] = 0;
  this->completed_count[1] = 0;
  this->completed_count[2] = 0;
  this->completed_count[3] = 0;
  this->thread_initialized_count = 0;
  std::condition_variable::condition_variable(&this->work_available_condition);
  lVar8 = 0x4a0;
  do {
    std::condition_variable::condition_variable
              ((condition_variable *)
               ((long)&(this->super_StateCreatorInterface)._vptr_StateCreatorInterface + lVar8));
    lVar8 = lVar8 + 0x30;
  } while (lVar8 != 0x560);
  (this->internal_enqueue_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->internal_enqueue_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->internal_enqueue_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->internal_enqueue_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->pipeline_work_queue_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->internal_enqueue_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->pipeline_work_queue_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->pipeline_work_queue_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->pipeline_work_queue_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->pipeline_work_queue_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->per_thread_data).
  super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->per_thread_data).
  super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->thread_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->per_thread_data).
  super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thread_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thread_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::queue<PipelineWorkItem,std::deque<PipelineWorkItem,std::allocator<PipelineWorkItem>>>::
  queue<std::deque<PipelineWorkItem,std::allocator<PipelineWorkItem>>,void>
            (&this->pipeline_work_queue);
  (this->validation_db_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->validation_whitelist_db)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  *(undefined8 *)((long)&(this->validation_db_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->validation_db_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->validation_db_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->validation_db_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->pipeline_stats_queue_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->pipeline_stats_db)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  (this->validation_blacklist_db)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  *(undefined8 *)((long)&(this->pipeline_stats_queue_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->pipeline_stats_queue_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->pipeline_stats_queue_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->pipeline_stats_queue_mutex).super___mutex_base._M_mutex + 8) = 0;
  pp_Var7 = &this->implicit_whitelist[0]._M_h._M_single_bucket;
  lVar8 = 0x230;
  do {
    ((_Hashtable *)(pp_Var7 + -6))->_M_buckets = pp_Var7;
    pp_Var7[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var7 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var7[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var7 + -2))->_M_max_load_factor = 1.0;
    pp_Var7[-1] = (__node_base_ptr)0x0;
    *pp_Var7 = (__node_base_ptr)0x0;
    pp_Var7 = pp_Var7 + 7;
    lVar8 = lVar8 + -0x38;
  } while (lVar8 != 0);
  (this->replayer_cache_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->replayer_cache_db)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  *(undefined8 *)((long)&(this->replayer_cache_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->replayer_cache_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->replayer_cache_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->replayer_cache_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->module_identifier_db_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->module_identifier_db)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  *(undefined8 *)((long)&(this->module_identifier_db_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->module_identifier_db_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->module_identifier_db_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->module_identifier_db_mutex).super___mutex_base._M_mutex + 8) = 0;
  pp_Var7 = &this->cached_blobs[0]._M_h._M_single_bucket;
  lVar8 = 0x230;
  do {
    ((_Hashtable *)(pp_Var7 + -6))->_M_buckets = pp_Var7;
    pp_Var7[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var7 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var7[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var7 + -2))->_M_max_load_factor = 1.0;
    pp_Var7[-1] = (__node_base_ptr)0x0;
    *pp_Var7 = (__node_base_ptr)0x0;
    pp_Var7 = pp_Var7 + 7;
    lVar8 = lVar8 + -0x38;
  } while (lVar8 != 0);
  *(undefined8 *)((long)&(this->hash_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->hash_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->hash_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->hash_lock).super___mutex_base._M_mutex + 8) = 0;
  (this->hash_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->graphics_parents)._M_h._M_buckets = &(this->graphics_parents)._M_h._M_single_bucket;
  (this->graphics_parents)._M_h._M_bucket_count = 1;
  (this->graphics_parents)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->graphics_parents)._M_h._M_element_count = 0;
  (this->graphics_parents)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->graphics_parents)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->graphics_parents)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->compute_parents)._M_h._M_buckets = &(this->compute_parents)._M_h._M_single_bucket;
  (this->compute_parents)._M_h._M_bucket_count = 1;
  (this->compute_parents)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->compute_parents)._M_h._M_element_count = 0;
  (this->compute_parents)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->compute_parents)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->compute_parents)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->raytracing_parents)._M_h._M_buckets = &(this->raytracing_parents)._M_h._M_single_bucket;
  (this->raytracing_parents)._M_h._M_bucket_count = 1;
  (this->raytracing_parents)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->raytracing_parents)._M_h._M_element_count = 0;
  (this->raytracing_parents)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->shutting_down = false;
  (this->device)._M_t.
  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>._M_t
  .super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>.
  super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl = (VulkanDevice *)0x0;
  this->device_was_init = false;
  memset(&(this->raytracing_parents)._M_h._M_rehash_policy._M_next_resize,0,0x150);
  bVar3 = device_opts_->want_amd_shader_info;
  bVar4 = device_opts_->null_device;
  bVar5 = device_opts_->want_pipeline_stats;
  iVar6 = device_opts_->device_index;
  pVVar1 = device_opts_->application_info;
  (this->device_opts).enable_validation = device_opts_->enable_validation;
  (this->device_opts).want_amd_shader_info = bVar3;
  (this->device_opts).null_device = bVar4;
  (this->device_opts).want_pipeline_stats = bVar5;
  (this->device_opts).device_index = iVar6;
  (this->device_opts).application_info = pVVar1;
  (this->device_opts).features = device_opts_->features;
  this->robustness = false;
  this->global_replayer = (StateReplayer *)0x0;
  this->global_database = (DatabaseInterface *)0x0;
  LOCK();
  (this->graphics_pipeline_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->compute_pipeline_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->raytracing_pipeline_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->shader_module_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->graphics_pipeline_count).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->compute_pipeline_count).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->raytracing_pipeline_count).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->shader_module_count).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->shader_module_evicted_count).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->thread_total_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->total_idle_ns).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->total_peak_memory).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pipeline_cache_hits).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pipeline_cache_misses).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->shader_module_total_compressed_size).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->shader_module_total_size).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::vector<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>::
  resize(&this->per_thread_data,(ulong)(this->num_worker_threads + 1));
  (this->shader_modules).target_size = (ulong)(this->opts).shader_cache_size_mb << 0x14;
  init_whitelist_db(this);
  init_blacklist_db(this);
  return;
}

Assistant:

ThreadedReplayer(const VulkanDevice::Options &device_opts_, const Options &opts_)
		: opts(opts_),
		  num_worker_threads(opts.num_threads), loop_count(opts.loop_count),
		  device_opts(device_opts_)
	{
		// Cannot use initializers for atomics.
		graphics_pipeline_ns.store(0);
		compute_pipeline_ns.store(0);
		raytracing_pipeline_ns.store(0);
		shader_module_ns.store(0);
		graphics_pipeline_count.store(0);
		compute_pipeline_count.store(0);
		raytracing_pipeline_count.store(0);
		shader_module_count.store(0);
		shader_module_evicted_count.store(0);
		thread_total_ns.store(0);
		total_idle_ns.store(0);
		total_peak_memory.store(0);
		pipeline_cache_hits.store(0);
		pipeline_cache_misses.store(0);

		shader_module_total_compressed_size.store(0);
		shader_module_total_size.store(0);
		per_thread_data.resize(num_worker_threads + 1);

		// Could potentially overflow on 32-bit.
#if ((SIZE_MAX / (1024 * 1024)) < UINT_MAX)
		size_t target_size;
		if (opts.shader_cache_size_mb <= (SIZE_MAX / (1024 * 1024)))
			target_size = size_t(opts.shader_cache_size_mb) * 1024 * 1024;
		else
			target_size = SIZE_MAX;
#else
		size_t target_size = size_t(opts.shader_cache_size_mb) * 1024 * 1024;
#endif

		shader_modules.set_target_size(target_size);
		init_whitelist_db();
		init_blacklist_db();
	}